

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTis.c
# Opt level: O2

void Gia_ManTisTest(Gia_Man_t *pInit)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Gia_Man_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  long lVar5;
  
  pGVar2 = pInit;
  p = Vec_IntAlloc((int)pInit);
  p_00 = Vec_IntAlloc((int)pGVar2);
  pGVar2 = Gia_ManTisDupMuxes(pInit);
  Gia_ManCreateRefs(pGVar2);
  for (lVar5 = 0; lVar5 < pGVar2->nObjs; lVar5 = lVar5 + 1) {
    iVar4 = (int)lVar5;
    pGVar3 = Gia_ManObj(pGVar2,iVar4);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if (((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) &&
       (pGVar2->pRefs[lVar5] != 1)) {
      Gia_ManTisCollectMffc(pGVar2,iVar4,p,p_00);
      Gia_ManTisPrintMffc(pGVar2,iVar4,p,p_00);
    }
  }
  for (iVar4 = 0; iVar4 < pGVar2->vCos->nSize; iVar4 = iVar4 + 1) {
    pGVar3 = Gia_ManCo(pGVar2,iVar4);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjFaninId0p(pGVar2,pGVar3);
    if (pGVar2->pRefs[iVar1] < 2) {
      iVar1 = Gia_ObjFaninId0p(pGVar2,pGVar3);
      Gia_ManTisCollectMffc(pGVar2,iVar1,p,p_00);
      iVar1 = Gia_ObjFaninId0p(pGVar2,pGVar3);
      Gia_ManTisPrintMffc(pGVar2,iVar1,p,p_00);
    }
  }
  Gia_ManStop(pGVar2);
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Gia_ManTisTest( Gia_Man_t * pInit )
{
    Gia_Man_t * p;
    Gia_Obj_t * pObj;
    Vec_Int_t * vMffc, * vLeaves;
    int i;
    vMffc = Vec_IntAlloc( 10 );
    vLeaves = Vec_IntAlloc( 10 );
    p = Gia_ManTisDupMuxes( pInit );
    Gia_ManCreateRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjRefNumId(p, i) == 1 )
            continue;
        Gia_ManTisCollectMffc( p, i, vMffc, vLeaves );
        Gia_ManTisPrintMffc( p, i, vMffc, vLeaves );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        if ( Gia_ObjRefNumId(p, Gia_ObjFaninId0p(p, pObj)) > 1 )
            continue;
        Gia_ManTisCollectMffc( p, Gia_ObjFaninId0p(p, pObj), vMffc, vLeaves );
        Gia_ManTisPrintMffc( p, Gia_ObjFaninId0p(p, pObj), vMffc, vLeaves );
    }
    Gia_ManStop( p );
    Vec_IntFree( vMffc );
    Vec_IntFree( vLeaves );
}